

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O3

void Saig_StrSimulateRound(Aig_Man_t *p0,Aig_Man_t *p1)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  Aig_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  
  pVVar8 = p0->vObjs;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      pAVar1 = (Aig_Obj_t *)pVVar8->pArray[lVar12];
      if (((pAVar1 != (Aig_Obj_t *)0x0) &&
          (((uVar6 = (uint)*(undefined8 *)&pAVar1->field_0x18, (uVar6 & 7) == 2 ||
            (0xfffffffd < (uVar6 & 7) - 7)) && (p0->pReprs != (Aig_Obj_t **)0x0)))) &&
         (pAVar2 = p0->pReprs[pAVar1->Id], pAVar2 != (Aig_Obj_t *)0x0)) {
        if (p1->pReprs == (Aig_Obj_t **)0x0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = p1->pReprs[pAVar2->Id];
        }
        if (pAVar7 != pAVar1) {
          __assert_fail("Aig_ObjRepr(p1, pObj1) == pObj0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                        ,0x132,"void Saig_StrSimulateRound(Aig_Man_t *, Aig_Man_t *)");
        }
        pvVar3 = (pAVar1->field_5).pData;
        lVar11 = 0;
        do {
          uVar6 = Aig_ManRandom(0);
          *(uint *)((long)pvVar3 + lVar11 * 4) = uVar6;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x10);
        pvVar3 = (pAVar1->field_5).pData;
        pvVar4 = (pAVar2->field_5).pData;
        lVar11 = 0;
        do {
          *(undefined4 *)((long)pvVar4 + lVar11 * 4) = *(undefined4 *)((long)pvVar3 + lVar11 * 4);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x10);
        pVVar8 = p0->vObjs;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar8->nSize);
  }
  lVar12 = 0;
  do {
    pVVar8 = p0->vObjs;
    if (0 < pVVar8->nSize) {
      lVar11 = 0;
      do {
        pAVar1 = (Aig_Obj_t *)pVVar8->pArray[lVar11];
        if (((pAVar1 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar1->field_0x18 & 7) - 7))
           && ((p0->pReprs == (Aig_Obj_t **)0x0 || (p0->pReprs[pAVar1->Id] == (Aig_Obj_t *)0x0)))) {
          Saig_StrSimulateNode(pAVar1,(int)lVar12);
          pVVar8 = p0->vObjs;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar8->nSize);
    }
    if (p0->nRegs < 1) {
      bVar13 = lVar12 == 0xf;
    }
    else {
      pVVar8 = p0->vCos;
      iVar9 = 0;
      do {
        uVar6 = p0->nTruePos + iVar9;
        if (((int)uVar6 < 0) || (pVVar8->nSize <= (int)uVar6)) goto LAB_006f5cdc;
        pvVar3 = pVVar8->pArray[uVar6];
        uVar5 = *(ulong *)((long)pvVar3 + 8);
        *(uint *)(*(long *)((long)pvVar3 + 0x28) + lVar12 * 4) =
             -((uint)uVar5 & 1) ^
             *(uint *)(*(long *)((uVar5 & 0xfffffffffffffffe) + 0x28) + lVar12 * 4);
        iVar9 = iVar9 + 1;
      } while (iVar9 < p0->nRegs);
      bVar13 = lVar12 == 0xf;
      if (0 < p0->nRegs && !bVar13) {
        pVVar8 = p0->vCos;
        iVar9 = 0;
        do {
          uVar6 = p0->nTruePos + iVar9;
          if (((((int)uVar6 < 0) || (pVVar8->nSize <= (int)uVar6)) ||
              (uVar10 = p0->nTruePis + iVar9, (int)uVar10 < 0)) || (p0->vCis->nSize <= (int)uVar10))
          goto LAB_006f5cdc;
          *(undefined4 *)(*(long *)((long)p0->vCis->pArray[uVar10] + 0x28) + 4 + lVar12 * 4) =
               *(undefined4 *)(*(long *)((long)pVVar8->pArray[uVar6] + 0x28) + lVar12 * 4);
          iVar9 = iVar9 + 1;
        } while (iVar9 < p0->nRegs);
        bVar13 = false;
      }
    }
    pVVar8 = p1->vObjs;
    if (0 < pVVar8->nSize) {
      lVar11 = 0;
      do {
        pAVar1 = (Aig_Obj_t *)pVVar8->pArray[lVar11];
        if (((pAVar1 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar1->field_0x18 & 7) - 7))
           && ((p1->pReprs == (Aig_Obj_t **)0x0 || (p1->pReprs[pAVar1->Id] == (Aig_Obj_t *)0x0)))) {
          Saig_StrSimulateNode(pAVar1,(int)lVar12);
          pVVar8 = p1->vObjs;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar8->nSize);
    }
    if (0 < p1->nRegs) {
      pVVar8 = p1->vCos;
      iVar9 = 0;
      do {
        uVar6 = p1->nTruePos + iVar9;
        if (((int)uVar6 < 0) || (pVVar8->nSize <= (int)uVar6)) goto LAB_006f5cdc;
        pvVar3 = pVVar8->pArray[uVar6];
        uVar5 = *(ulong *)((long)pvVar3 + 8);
        *(uint *)(*(long *)((long)pvVar3 + 0x28) + lVar12 * 4) =
             -((uint)uVar5 & 1) ^
             *(uint *)(*(long *)((uVar5 & 0xfffffffffffffffe) + 0x28) + lVar12 * 4);
        iVar9 = iVar9 + 1;
      } while (iVar9 < p1->nRegs);
      if (!bVar13 && 0 < p1->nRegs) {
        pVVar8 = p1->vCos;
        iVar9 = 0;
        do {
          uVar6 = p1->nTruePos + iVar9;
          if (((((int)uVar6 < 0) || (pVVar8->nSize <= (int)uVar6)) ||
              (uVar10 = p1->nTruePis + iVar9, (int)uVar10 < 0)) || (p1->vCis->nSize <= (int)uVar10))
          {
LAB_006f5cdc:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          *(undefined4 *)(*(long *)((long)p1->vCis->pArray[uVar10] + 0x28) + 4 + lVar12 * 4) =
               *(undefined4 *)(*(long *)((long)pVVar8->pArray[uVar6] + 0x28) + lVar12 * 4);
          iVar9 = iVar9 + 1;
        } while (iVar9 < p1->nRegs);
      }
    }
    lVar12 = lVar12 + 1;
    if (lVar12 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void Saig_StrSimulateRound( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t * pObj0, * pObj1;
    int f, i;
    // simulate the nodes
    Aig_ManForEachObj( p0, pObj0, i )
    {
        if ( !Aig_ObjIsCi(pObj0) && !Aig_ObjIsNode(pObj0) )
           continue;
        pObj1 = Aig_ObjRepr(p0, pObj0);
        if ( pObj1 == NULL )
            continue;
        assert( Aig_ObjRepr(p1, pObj1) == pObj0 );
        Saig_StrSimAssignRandom( pObj0 );
        Saig_StrSimTransfer( pObj0, pObj1 );
    }
    // simulate the timeframes
    for ( f = 0; f < SAIG_WORDS; f++ )
    {
        // simulate the first AIG
        Aig_ManForEachNode( p0, pObj0, i )
            if ( Aig_ObjRepr(p0, pObj0) == NULL )
                Saig_StrSimulateNode( pObj0, f );
        Saig_ManForEachLi( p0, pObj0, i )
            Saig_StrSimSaveOutput( pObj0, f );
        if ( f < SAIG_WORDS - 1 )
            Saig_ManForEachLiLo( p0, pObj0, pObj1, i )
                Saig_StrSimTransferNext( pObj0, pObj1, f );
        // simulate the second AIG
        Aig_ManForEachNode( p1, pObj1, i )
            if ( Aig_ObjRepr(p1, pObj1) == NULL )
                Saig_StrSimulateNode( pObj1, f );
        Saig_ManForEachLi( p1, pObj1, i )
            Saig_StrSimSaveOutput( pObj1, f );
        if ( f < SAIG_WORDS - 1 )
            Saig_ManForEachLiLo( p1, pObj1, pObj0, i )
                Saig_StrSimTransferNext( pObj1, pObj0, f );
    }
}